

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O1

bool __thiscall
phpconvert::ZendParser::isRestricted(ZendParser *this,string *className,string *classNameLower)

{
  iterator iVar1;
  bool bVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this->keywords->_M_t,classNameLower);
  bVar2 = true;
  if ((_Rb_tree_header *)iVar1._M_node == &(this->keywords->_M_t)._M_impl.super__Rb_tree_header) {
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->builtInTypes->_M_t,className);
    bVar2 = (_Rb_tree_header *)iVar1._M_node !=
            &(this->builtInTypes->_M_t)._M_impl.super__Rb_tree_header;
  }
  return bVar2;
}

Assistant:

bool ZendParser::isRestricted(const string &className, const string &classNameLower) { //@todo has no sense
        return isKeyword(classNameLower) //cant be keyword here , keywords must not be touched
               || isBuiltInType(className); //@todo isDuplicate too
    }